

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

xxh_u32 XXH32_finalize(xxh_u32 h32,xxh_u8 *ptr,size_t len,XXH_alignment align)

{
  xxh_u32 xVar1;
  uint uVar2;
  void *ptr_00;
  uint in_EDX;
  byte *in_RSI;
  xxh_u32 in_EDI;
  byte *local_10;
  xxh_u32 local_8;
  xxh_u32 local_4;
  
  ptr_00 = (void *)(ulong)(in_EDX & 0xf);
  local_10 = in_RSI;
  local_8 = in_EDI;
  local_4 = in_EDI;
  switch(ptr_00) {
  case (void *)0xc:
    xVar1 = XXH_readLE32_align(ptr_00,XXH_aligned);
    uVar2 = xVar1 * -0x3d4d51c3 + in_EDI;
    local_8 = (uVar2 * 0x20000 | uVar2 >> 0xf) * 0x27d4eb2f;
  case (void *)0x8:
    xVar1 = XXH_readLE32_align(ptr_00,XXH_aligned);
    uVar2 = xVar1 * -0x3d4d51c3 + local_8;
    local_8 = (uVar2 * 0x20000 | uVar2 >> 0xf) * 0x27d4eb2f;
  case (void *)0x4:
    xVar1 = XXH_readLE32_align(ptr_00,XXH_aligned);
    uVar2 = xVar1 * -0x3d4d51c3 + local_8;
    local_4 = XXH32_avalanche((uVar2 * 0x20000 | uVar2 >> 0xf) * 0x27d4eb2f);
    break;
  case (void *)0xd:
    xVar1 = XXH_readLE32_align(ptr_00,XXH_aligned);
    uVar2 = xVar1 * -0x3d4d51c3 + in_EDI;
    local_10 = in_RSI + 4;
    local_8 = (uVar2 * 0x20000 | uVar2 >> 0xf) * 0x27d4eb2f;
  case (void *)0x9:
    xVar1 = XXH_readLE32_align(ptr_00,XXH_aligned);
    uVar2 = xVar1 * -0x3d4d51c3 + local_8;
    local_10 = local_10 + 4;
    local_8 = (uVar2 * 0x20000 | uVar2 >> 0xf) * 0x27d4eb2f;
  case (void *)0x5:
    xVar1 = XXH_readLE32_align(ptr_00,XXH_aligned);
    uVar2 = xVar1 * -0x3d4d51c3 + local_8;
    uVar2 = (uint)local_10[4] * 0x165667b1 + (uVar2 * 0x20000 | uVar2 >> 0xf) * 0x27d4eb2f;
    local_4 = XXH32_avalanche((uVar2 * 0x800 | uVar2 >> 0x15) * -0x61c8864f);
    break;
  case (void *)0xe:
    xVar1 = XXH_readLE32_align(ptr_00,XXH_aligned);
    uVar2 = xVar1 * -0x3d4d51c3 + in_EDI;
    local_10 = in_RSI + 4;
    local_8 = (uVar2 * 0x20000 | uVar2 >> 0xf) * 0x27d4eb2f;
  case (void *)0xa:
    xVar1 = XXH_readLE32_align(ptr_00,XXH_aligned);
    uVar2 = xVar1 * -0x3d4d51c3 + local_8;
    local_10 = local_10 + 4;
    local_8 = (uVar2 * 0x20000 | uVar2 >> 0xf) * 0x27d4eb2f;
  case (void *)0x6:
    xVar1 = XXH_readLE32_align(ptr_00,XXH_aligned);
    uVar2 = xVar1 * -0x3d4d51c3 + local_8;
    uVar2 = (uint)local_10[4] * 0x165667b1 + (uVar2 * 0x20000 | uVar2 >> 0xf) * 0x27d4eb2f;
    uVar2 = (uint)local_10[5] * 0x165667b1 + (uVar2 * 0x800 | uVar2 >> 0x15) * -0x61c8864f;
    local_4 = XXH32_avalanche((uVar2 * 0x800 | uVar2 >> 0x15) * -0x61c8864f);
    break;
  case (void *)0xf:
    xVar1 = XXH_readLE32_align(ptr_00,XXH_aligned);
    uVar2 = xVar1 * -0x3d4d51c3 + in_EDI;
    local_10 = in_RSI + 4;
    local_8 = (uVar2 * 0x20000 | uVar2 >> 0xf) * 0x27d4eb2f;
  case (void *)0xb:
    xVar1 = XXH_readLE32_align(ptr_00,XXH_aligned);
    uVar2 = xVar1 * -0x3d4d51c3 + local_8;
    local_10 = local_10 + 4;
    local_8 = (uVar2 * 0x20000 | uVar2 >> 0xf) * 0x27d4eb2f;
  case (void *)0x7:
    xVar1 = XXH_readLE32_align(ptr_00,XXH_aligned);
    uVar2 = xVar1 * -0x3d4d51c3 + local_8;
    local_10 = local_10 + 4;
    local_8 = (uVar2 * 0x20000 | uVar2 >> 0xf) * 0x27d4eb2f;
  case (void *)0x3:
    uVar2 = (uint)*local_10 * 0x165667b1 + local_8;
    local_8 = (uVar2 * 0x800 | uVar2 >> 0x15) * -0x61c8864f;
    local_10 = local_10 + 1;
  case (void *)0x2:
    uVar2 = (uint)*local_10 * 0x165667b1 + local_8;
    local_8 = (uVar2 * 0x800 | uVar2 >> 0x15) * -0x61c8864f;
    local_10 = local_10 + 1;
  case (void *)0x1:
    uVar2 = (uint)*local_10 * 0x165667b1 + local_8;
    local_8 = (uVar2 * 0x800 | uVar2 >> 0x15) * -0x61c8864f;
  case (void *)0x0:
    local_4 = XXH32_avalanche(local_8);
  }
  return local_4;
}

Assistant:

static xxh_u32 XXH32_finalize(xxh_u32 h32, const xxh_u8* ptr, size_t len,
                              XXH_alignment align) {
#define XXH_PROCESS1                           \
  do {                                         \
    h32 += (*ptr++) * XXH_PRIME32_5;           \
    h32 = XXH_rotl32(h32, 11) * XXH_PRIME32_1; \
  } while (0)

#define XXH_PROCESS4                           \
  do {                                         \
    h32 += XXH_get32bits(ptr) * XXH_PRIME32_3; \
    ptr += 4;                                  \
    h32 = XXH_rotl32(h32, 17) * XXH_PRIME32_4; \
  } while (0)

  /* Compact rerolled version */
  if (XXH_REROLL) {
    len &= 15;
    while (len >= 4) {
      XXH_PROCESS4;
      len -= 4;
    }
    while (len > 0) {
      XXH_PROCESS1;
      --len;
    }
    return XXH32_avalanche(h32);
  } else {
    switch (len & 15) /* or switch(bEnd - p) */ {
      case 12:
        XXH_PROCESS4;
        /* fallthrough */
      case 8:
        XXH_PROCESS4;
        /* fallthrough */
      case 4:
        XXH_PROCESS4;
        return XXH32_avalanche(h32);

      case 13:
        XXH_PROCESS4;
        /* fallthrough */
      case 9:
        XXH_PROCESS4;
        /* fallthrough */
      case 5:
        XXH_PROCESS4;
        XXH_PROCESS1;
        return XXH32_avalanche(h32);

      case 14:
        XXH_PROCESS4;
        /* fallthrough */
      case 10:
        XXH_PROCESS4;
        /* fallthrough */
      case 6:
        XXH_PROCESS4;
        XXH_PROCESS1;
        XXH_PROCESS1;
        return XXH32_avalanche(h32);

      case 15:
        XXH_PROCESS4;
        /* fallthrough */
      case 11:
        XXH_PROCESS4;
        /* fallthrough */
      case 7:
        XXH_PROCESS4;
        /* fallthrough */
      case 3:
        XXH_PROCESS1;
        /* fallthrough */
      case 2:
        XXH_PROCESS1;
        /* fallthrough */
      case 1:
        XXH_PROCESS1;
        /* fallthrough */
      case 0:
        return XXH32_avalanche(h32);
    }
    XXH_ASSERT(0);
    return h32; /* reaching this point is deemed impossible */
  }
}